

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-access-set.hxx
# Opt level: O0

iterator __thiscall
andres::RandomAccessSet<int,_std::less<int>,_std::allocator<int>_>::find
          (RandomAccessSet<int,_std::less<int>,_std::allocator<int>_> *this,key_type *value)

{
  key_type *__x;
  bool bVar1;
  reference __y;
  bool local_31;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  key_type *local_20;
  key_type *value_local;
  RandomAccessSet<int,_std::less<int>,_std::allocator<int>_> *this_local;
  iterator i;
  
  local_20 = value;
  value_local = (key_type *)this;
  this_local = (RandomAccessSet<int,_std::less<int>,_std::allocator<int>_> *)lower_bound(this,value)
  ;
  local_28._M_current = (int *)end(this);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &this_local,&local_28);
  __x = local_20;
  local_31 = false;
  if (bVar1) {
    __y = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &this_local);
    local_31 = std::less<int>::operator()((less<int> *)&this->field_0x18,__x,__y);
  }
  if (local_31 != false) {
    this_local = (RandomAccessSet<int,_std::less<int>,_std::allocator<int>_> *)end(this);
  }
  return (iterator)(int *)this_local;
}

Assistant:

inline typename RandomAccessSet<Key, Comparison, Allocator>::iterator
RandomAccessSet<Key, Comparison, Allocator>::find(
    const key_type& value
) {
    iterator i(lower_bound(value));
    if(i != end() && compare_(value, *i)) {
        i = end();
    }
    return i;
}